

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int send_handshake_flow(quicly_conn_t *conn,size_t epoch,quicly_send_context_t *s,int ack_only,
                       int send_probe)

{
  uint64_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  st_quicly_pn_space_t *space;
  quicly_stream_t *stream;
  ulong uVar5;
  quicly_conn_t *_conn;
  int local_34;
  
  space = setup_send_space(conn,epoch,s);
  iVar3 = 0;
  if (space != (st_quicly_pn_space_t *)0x0) {
    if (space->unacked_count == 0 && send_probe == 0) {
      if (ack_only != 0) {
        return 0;
      }
    }
    else {
      iVar3 = send_ack(conn,space,s);
      if (ack_only != 0 || iVar3 != 0) {
        return iVar3;
      }
    }
    local_34 = send_probe;
    if (((conn->egress).pending_flows >> ((uint)epoch & 0x1f) & 1) != 0) {
      do {
        stream = quicly_get_stream(conn,~epoch);
        if (stream == (quicly_stream_t *)0x0) {
          __assert_fail("stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0xf92,
                        "int send_handshake_flow(quicly_conn_t *, size_t, quicly_send_context_t *, int, int)"
                       );
        }
        iVar3 = quicly_send_stream(stream,s);
        if (iVar3 != 0) {
          return iVar3;
        }
        resched_stream_data(stream);
        local_34 = 0;
      } while ((1 << ((byte)epoch & 0x1f) & (uint)(conn->egress).pending_flows) != 0);
    }
    iVar3 = 0;
    if ((local_34 != 0) && (iVar3 = _do_allocate_frame(conn,s,1,1), iVar3 == 0)) {
      puVar2 = s->dst;
      s->dst = puVar2 + 1;
      *puVar2 = '\x01';
      (conn->egress).last_retransmittable_sent_at = (conn->stash).now;
      puVar1 = &(conn->super).stats.num_frames_sent.ping;
      *puVar1 = *puVar1 + 1;
      iVar3 = 0;
      if ((quicly_trace_fp != (FILE *)0x0) &&
         (iVar4 = ptls_skip_tracing((conn->crypto).tls), iVar4 == 0)) {
        iVar3 = 0;
        uVar5 = 0;
        if (conn != (quicly_conn_t *)0x0) {
          uVar5 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
        }
        fprintf((FILE *)quicly_trace_fp,"{\"type\":\"ping-send\", \"conn\":%u, \"time\":%lld}\n",
                uVar5,(conn->stash).now);
      }
    }
  }
  return iVar3;
}

Assistant:

static int send_handshake_flow(quicly_conn_t *conn, size_t epoch, quicly_send_context_t *s, int ack_only, int send_probe)
{
    struct st_quicly_pn_space_t *space;
    int ret = 0;

    /* setup send epoch, or return if it's impossible to send in this epoch */
    if ((space = setup_send_space(conn, epoch, s)) == NULL)
        return 0;

    /* send ACK */
    if (space != NULL && (space->unacked_count != 0 || send_probe))
        if ((ret = send_ack(conn, space, s)) != 0)
            goto Exit;

    if (!ack_only) {
        /* send data */
        while ((conn->egress.pending_flows & (uint8_t)(1 << epoch)) != 0) {
            quicly_stream_t *stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + epoch));
            assert(stream != NULL);
            if ((ret = quicly_send_stream(stream, s)) != 0)
                goto Exit;
            resched_stream_data(stream);
            send_probe = 0;
        }

        /* send probe if requested */
        if (send_probe) {
            if ((ret = _do_allocate_frame(conn, s, 1, 1)) != 0)
                goto Exit;
            *s->dst++ = QUICLY_FRAME_TYPE_PING;
            conn->egress.last_retransmittable_sent_at = conn->stash.now;
            ++conn->super.stats.num_frames_sent.ping;
            QUICLY_PROBE(PING_SEND, conn, conn->stash.now);
        }
    }

Exit:
    return ret;
}